

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
read_compressed_run(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                   uint8_t *start,uint8_t *end)

{
  iterator __position;
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint local_2c;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (start < end) {
    uVar3 = 0xffffffff;
    iVar2 = 0;
    bVar1 = 0;
    do {
      iVar2 = ((*start & 0x7f) << (bVar1 & 0x1f)) + iVar2;
      if ((char)*start < '\0') {
        bVar1 = bVar1 + 7;
      }
      else {
        uVar3 = uVar3 + iVar2 + 1;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_2c = uVar3;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (__return_storage_ptr__,__position,&local_2c);
        }
        else {
          *__position._M_current = uVar3;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        bVar1 = 0;
        iVar2 = 0;
      }
      start = start + 1;
    } while (start != end);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<FileId> read_compressed_run(const uint8_t *start,
                                        const uint8_t *end) {
    std::vector<FileId> res;
    uint64_t acc = 0;
    uint32_t shift = 0;
    int64_t prev = -1;

    for (const uint8_t *ptr = start; ptr < end; ++ptr) {
        uint32_t next = *ptr;

        acc += (next & 0x7FU) << shift;
        shift += 7U;
        if ((next & 0x80U) == 0) {
            prev += acc + 1;
            res.push_back(prev);
            acc = 0;
            shift = 0;
        }
    }

    return res;
}